

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

bool __thiscall
Rml::DataExpressionInterface::SetValue
          (DataExpressionInterface *this,DataAddress *address,Variant *value)

{
  DataModel *this_00;
  bool bVar1;
  const_reference variable_name;
  undefined1 local_38 [8];
  DataVariable variable;
  bool result;
  Variant *value_local;
  DataAddress *address_local;
  DataExpressionInterface *this_local;
  
  variable.ptr._7_1_ = 0;
  if ((this->data_model != (DataModel *)0x0) &&
     (bVar1 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                        (address), !bVar1)) {
    _local_38 = DataModel::GetVariable(this->data_model,address);
    bVar1 = DataVariable::operator_cast_to_bool((DataVariable *)local_38);
    if (bVar1) {
      variable.ptr._7_1_ = DataVariable::Set((DataVariable *)local_38,value);
    }
    if ((variable.ptr._7_1_ & 1) != 0) {
      this_00 = this->data_model;
      variable_name =
           ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::front
                     (address);
      DataModel::DirtyVariable(this_00,&variable_name->name);
    }
  }
  return (bool)(variable.ptr._7_1_ & 1);
}

Assistant:

bool DataExpressionInterface::SetValue(const DataAddress& address, const Variant& value) const
{
	bool result = false;
	if (data_model && !address.empty())
	{
		if (DataVariable variable = data_model->GetVariable(address))
			result = variable.Set(value);

		if (result)
			data_model->DirtyVariable(address.front().name);
	}
	return result;
}